

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

external_ip * __thiscall
libtorrent::aux::session_impl::external_address
          (external_ip *__return_storage_ptr__,session_impl *this)

{
  undefined4 uVar1;
  pointer psVar2;
  element_type *peVar3;
  undefined4 uVar5;
  unsigned_long uVar4;
  ulong uVar6;
  shared_ptr<libtorrent::aux::listen_socket_t> *i;
  pointer psVar7;
  bool bVar8;
  address local_addr;
  address ips [2] [2];
  address local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  address local_a8;
  address local_88;
  address local_68;
  address local_48;
  
  local_48.ipv6_address_.addr_.__in6_u._8_8_ = 0;
  local_48.ipv6_address_.scope_id_ = 0;
  local_48.type_ = ipv4;
  local_48.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  local_48.ipv6_address_.addr_.__in6_u._0_8_ = 0;
  local_68.ipv6_address_.addr_.__in6_u._8_8_ = 0;
  local_68.ipv6_address_.scope_id_ = 0;
  local_68.type_ = ipv4;
  local_68.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  local_68.ipv6_address_.addr_.__in6_u._0_8_ = 0;
  local_88.ipv6_address_.addr_.__in6_u._8_8_ = 0;
  local_88.ipv6_address_.scope_id_ = 0;
  local_88.type_ = ipv4;
  local_88.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  local_88.ipv6_address_.addr_.__in6_u._0_8_ = 0;
  local_a8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
  local_a8.ipv6_address_.scope_id_ = 0;
  local_a8.type_ = ipv4;
  local_a8.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  local_a8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
  psVar2 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar7 = (this->m_listen_sockets).
                super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar2; psVar7 = psVar7 + 1) {
    peVar3 = (psVar7->
             super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar1 = (peVar3->external_address).m_external_address.type_;
    uVar5 = (peVar3->external_address).m_external_address.ipv4_address_;
    local_b8 = *(undefined8 *)
                &(peVar3->external_address).m_external_address.ipv6_address_.addr_.__in6_u;
    uStack_b0 = *(undefined8 *)
                 ((long)&(peVar3->external_address).m_external_address.ipv6_address_.addr_.__in6_u +
                 8);
    bVar8 = uVar1 == 1;
    if (((&local_a8)[bVar8].type_ == ipv4) && ((&local_a8)[bVar8].ipv4_address_.addr_.s_addr == 0))
    {
      uVar4 = (peVar3->external_address).m_external_address.ipv6_address_.scope_id_;
      (&local_a8)[bVar8].type_ = uVar1;
      (&local_a8)[bVar8].ipv4_address_ = (address_v4)uVar5;
      *(undefined8 *)&(&local_a8)[bVar8].ipv6_address_.addr_.__in6_u = local_b8;
      *(undefined8 *)((long)&(&local_a8)[bVar8].ipv6_address_.addr_.__in6_u + 8) = uStack_b0;
      (&local_a8)[bVar8].ipv6_address_.scope_id_ = uVar4;
    }
    bVar8 = (peVar3->local_endpoint).impl_.data_.base.sa_family != 2;
    if (bVar8) {
      local_d8.ipv6_address_.addr_.__in6_u._0_8_ =
           *(undefined8 *)((long)&(peVar3->local_endpoint).impl_.data_ + 8);
      local_d8.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&(peVar3->local_endpoint).impl_.data_ + 0x10);
      local_d8.ipv6_address_.scope_id_ =
           (unsigned_long)(peVar3->local_endpoint).impl_.data_.v6.sin6_scope_id;
      local_d8.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      local_d8.ipv4_address_.addr_.s_addr =
           (in4_addr_type)(peVar3->local_endpoint).impl_.data_.v6.sin6_flowinfo;
      local_d8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_d8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_d8.ipv6_address_.scope_id_ = 0;
    }
    local_d8.type_ = (anon_enum_32)bVar8;
    bVar8 = is_local(&local_d8);
    if (((&local_a8)[(ulong)bVar8 * 2 + (ulong)(local_d8.type_ == ipv6)].type_ == ipv4) &&
       ((&local_a8)[(ulong)bVar8 * 2 + (ulong)(local_d8.type_ == ipv6)].ipv4_address_.addr_.s_addr
        == 0)) {
      bVar8 = is_local(&local_d8);
      uVar6 = (ulong)(local_d8.type_ == ipv6);
      (&local_a8)[(ulong)bVar8 * 2 + uVar6].type_ = local_d8.type_;
      (&local_a8)[(ulong)bVar8 * 2 + uVar6].ipv4_address_ =
           (address_v4)local_d8.ipv4_address_.addr_.s_addr;
      *(undefined8 *)&(&local_a8)[(ulong)bVar8 * 2 + uVar6].ipv6_address_.addr_.__in6_u =
           local_d8.ipv6_address_.addr_.__in6_u._0_8_;
      *(undefined8 *)((long)&(&local_a8)[(ulong)bVar8 * 2 + uVar6].ipv6_address_.addr_.__in6_u + 8)
           = local_d8.ipv6_address_.addr_.__in6_u._8_8_;
      (&local_a8)[(ulong)bVar8 * 2 + uVar6].ipv6_address_.scope_id_ =
           local_d8.ipv6_address_.scope_id_;
    }
  }
  external_ip::external_ip(__return_storage_ptr__,&local_68,&local_a8,&local_48,&local_88);
  return __return_storage_ptr__;
}

Assistant:

aux::external_ip session_impl::external_address() const
	{
		address ips[2][2];

		// take the first IP we find which matches each category
		for (auto const& i : m_listen_sockets)
		{
			address external_addr = i->external_address.external_address();
			if (ips[0][external_addr.is_v6()] == address())
				ips[0][external_addr.is_v6()] = external_addr;
			address local_addr = i->local_endpoint.address();
			if (ips[is_local(local_addr)][local_addr.is_v6()] == address())
				ips[is_local(local_addr)][local_addr.is_v6()] = local_addr;
		}

		return {ips[1][0], ips[0][0], ips[1][1], ips[0][1]};
	}